

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

cmListFileContext * __thiscall
cmDebugger_impl::CurrentLine(cmListFileContext *__return_storage_ptr__,cmDebugger_impl *this)

{
  cmListFileContext::cmListFileContext(__return_storage_ptr__,&this->currentLocation);
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext CurrentLine() const override { return currentLocation; }